

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint *puVar6;
  ImFont *pIVar7;
  ImFontAtlasCustomRect *pIVar8;
  long lVar9;
  int i;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int i_1;
  uint uVar17;
  float fVar19;
  ImVec2 local_40;
  ImVec2 local_38;
  ulong uVar18;
  
  iVar11 = atlas->PackIdMouseCursors;
  pIVar8 = (atlas->CustomRects).Data;
  uVar3 = pIVar8[iVar11].X;
  if ((atlas->Flags & 2) == 0) {
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8[iVar11].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar8[iVar11].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8[iVar11].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x7b,(uint)pIVar8[iVar11].Y,0x7a,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          - XX       XX ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         -X..X     X..X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         -X...X   X...XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         - X...X X...X XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         -  X...X...X  X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       -   X.....X   X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    -    X...X    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  -     X.X     X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X -    X...X    X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..X-   X.....X   X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..X-  X...X...X  X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........X- X...X X...X X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............X-X...X   X...XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............X-X..X     X..XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............X- XX       XX X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............X--------------X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    iVar12 = atlas->TexWidth;
    lVar9 = (ulong)pIVar8[iVar11].Y * (long)iVar12 + (ulong)uVar3;
    lVar10 = (long)(int)lVar9;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      lVar9 = (long)(iVar12 + (int)lVar9);
      atlas->TexPixelsRGBA32[lVar9 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar9] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar10 + 1] = 0xffffffff;
      atlas->TexPixelsRGBA32[lVar10] = 0xffffffff;
    }
    else {
      lVar10 = lVar10 + iVar12;
      atlas->TexPixelsAlpha8[lVar10 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar10] = 0xff;
      atlas->TexPixelsAlpha8[lVar9 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar9] = 0xff;
    }
  }
  uVar13._0_2_ = pIVar8[iVar11].X;
  uVar13._2_2_ = pIVar8[iVar11].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar13 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar13 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar8 = (atlas->CustomRects).Data + atlas->PackIdLines;
    lVar9 = 0;
    iVar11 = 0;
    lVar10 = 0;
    while (lVar10 != 0x40) {
      uVar13 = (uint)pIVar8->Width;
      puVar5 = atlas->TexPixelsAlpha8;
      iVar12 = (int)lVar10;
      if (puVar5 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar14 = (ulong)(((uint)pIVar8->Y + iVar12) * atlas->TexWidth + (uint)pIVar8->X);
        uVar17 = iVar11 + uVar13 >> 1;
        uVar18 = (ulong)uVar17;
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          puVar6[uVar14 + uVar15] = 0xffffff;
        }
        for (lVar16 = 0; lVar10 != lVar16; lVar16 = lVar16 + 1) {
          puVar6[uVar18 + uVar14 + lVar16] = 0xffffffff;
        }
        for (uVar15 = 0; (iVar11 + uVar13) - uVar17 != uVar15; uVar15 = uVar15 + 1) {
          *(undefined4 *)((long)puVar6 + uVar15 * 4 + lVar9 + uVar18 * 4 + uVar14 * 4) = 0xffffff;
        }
      }
      else {
        uVar14 = (ulong)(((uint)pIVar8->Y + iVar12) * atlas->TexWidth + (uint)pIVar8->X);
        uVar17 = iVar11 + uVar13 >> 1;
        uVar18 = (ulong)uVar17;
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          puVar5[uVar15 + uVar14] = '\0';
        }
        for (lVar16 = 0; lVar10 != lVar16; lVar16 = lVar16 + 1) {
          puVar5[lVar16 + uVar14 + uVar18] = 0xff;
        }
        for (uVar15 = 0; (iVar11 + uVar13) - uVar17 != uVar15; uVar15 = uVar15 + 1) {
          puVar5[uVar15 + uVar14 + uVar18 + lVar10] = '\0';
        }
      }
      uVar13 = uVar13 - iVar12 >> 1;
      uVar3 = pIVar8->X;
      uVar4 = pIVar8->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar19 = (atlas->TexUvScale).y;
      atlas->TexUvLines[lVar10].x = (float)((uVar13 + uVar3) - 1) * fVar1;
      fVar19 = ((float)(int)(uVar4 + 1 + iVar12) * fVar19 +
               (float)(int)((uint)uVar4 + iVar12) * fVar19) * 0.5;
      atlas->TexUvLines[lVar10].y = fVar19;
      atlas->TexUvLines[lVar10].z = fVar1 * (float)(uVar13 + (int)(lVar10 + 1) + (uint)uVar3);
      atlas->TexUvLines[lVar10].w = fVar19;
      iVar11 = iVar11 + -1;
      lVar9 = lVar9 + 4;
      lVar10 = lVar10 + 1;
    }
  }
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < (atlas->CustomRects).Size; lVar10 = lVar10 + 1) {
    pIVar8 = (atlas->CustomRects).Data;
    pIVar7 = *(ImFont **)((long)&pIVar8->Font + lVar9);
    if ((pIVar7 != (ImFont *)0x0) &&
       (iVar11 = *(int *)((long)&pIVar8->GlyphID + lVar9), iVar11 != 0)) {
      local_38.x = 0.0;
      local_38.y = 0.0;
      local_40.x = 0.0;
      local_40.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(ImFontAtlasCustomRect *)((long)&pIVar8->Width + lVar9),&local_38,&local_40);
      fVar1 = *(float *)((long)&(pIVar8->GlyphOffset).x + lVar9);
      fVar19 = *(float *)((long)&(pIVar8->GlyphOffset).y + lVar9);
      ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar11,fVar1,fVar19,
                       (float)*(ushort *)((long)&pIVar8->Width + lVar9) + fVar1,
                       (float)*(ushort *)((long)&pIVar8->Height + lVar9) + fVar19,local_38.x,
                       local_38.y,local_40.x,local_40.y,
                       *(float *)((long)&pIVar8->GlyphAdvanceX + lVar9));
    }
    lVar9 = lVar9 + 0x20;
  }
  for (lVar10 = 0; lVar10 < (atlas->Fonts).Size; lVar10 = lVar10 + 1) {
    pIVar7 = (atlas->Fonts).Data[lVar10];
    if (pIVar7->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar7);
    }
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}